

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

Am_Object * __thiscall
Am_Object::Add_Part(Am_Object *this,Am_Slot_Key key,Am_Object *new_part,Am_Slot_Flags set_flags)

{
  Am_Part_Demon *pAVar1;
  Am_Slot_Data *pAVar2;
  bool bVar3;
  ostream *poVar4;
  Am_Wrapper *pAVar5;
  Am_Object in_stack_fffffffffffffe78;
  Am_Object in_stack_fffffffffffffe80;
  am_CList *this_00;
  Am_Object in_stack_fffffffffffffe88;
  Am_Slot local_e0;
  Am_Slot local_d8;
  undefined1 local_d0 [8];
  Am_Value newval;
  Am_Value oldval;
  Am_Object local_a8;
  Am_Object local_a0;
  Am_Object local_98;
  Am_Object local_90;
  Am_Object local_88;
  Am_Constraint_Context *local_80;
  Am_Constraint_Context *old_cc;
  Am_Slot_Data *new_slot;
  Am_Object_Data *prev_owner;
  Am_Object_Data *added_part;
  Am_Object obj;
  Am_Object local_40;
  Am_Object prev_part;
  Am_Slot_Data *slot;
  Am_Slot_Flags set_flags_local;
  Am_Object *new_part_local;
  Am_Slot_Key key_local;
  Am_Object *this_local;
  
  if (this->data == (Am_Object_Data *)0x0) {
    slot_error("Add_Part called on a (0L) object",key);
  }
  prev_part.data = (Am_Object_Data *)Am_Object_Data::find_slot(this->data,key);
  Am_Object(&local_40);
  if ((prev_part.data != (Am_Object_Data *)0x0) &&
     (*(short *)&((prev_part.data)->super_Am_Wrapper).super_Am_Registered_Type.
                 _vptr_Am_Registered_Type != 0x1002)) {
    if (((ulong)(prev_part.data)->demon_set & 0x20) == 0) {
      if ((set_flags & 8) == 0) {
        Am_Wrapper::Note_Reference(&(prev_part.data)->prototype->super_Am_Wrapper);
        Am_Object((Am_Object *)&added_part,(prev_part.data)->prototype);
        poVar4 = std::operator<<((ostream *)&std::cerr,
                                 "** Add_Part can only be called with slots that are not already in the object.  But Object "
                                );
        poVar4 = ::operator<<(poVar4,(Am_Object *)&added_part);
        std::operator<<(poVar4," already has slot ");
        Am_Print_Key((ostream *)&std::cerr,*(Am_Slot_Key *)&(prev_part.data)->next_part);
        std::operator<<((ostream *)&std::cerr,".\n");
        Am_Error((Am_Object *)&added_part,*(Am_Slot_Key *)&(prev_part.data)->next_part);
        this_local = &Am_No_Object;
        ~Am_Object((Am_Object *)&added_part);
        goto LAB_0025d43b;
      }
    }
    else {
      if ((set_flags & 8) == 0) {
        slot_error("Add_Part called on part slot which is already there.  Use Set_Part instead",
                   (Am_Slot_Data *)prev_part.data);
        this_local = &Am_No_Object;
        goto LAB_0025d43b;
      }
      Get_Object(&obj,(Am_Slot_Key)this,(ulong)key);
      operator=(&local_40,&obj);
      ~Am_Object(&obj);
    }
  }
  bVar3 = Valid(new_part);
  this_local = this;
  if (bVar3) {
    prev_owner = new_part->data;
    new_slot = (Am_Slot_Data *)(prev_owner->owner_slot).super_Am_Value.value.wrapper_value;
    if (new_slot != (Am_Slot_Data *)0x0) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"** Attempted to add object, ");
      poVar4 = ::operator<<(poVar4,new_part);
      poVar4 = std::operator<<(poVar4,", to object, ");
      poVar4 = ::operator<<(poVar4,this);
      poVar4 = std::operator<<(poVar4,", when it already has owner, ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,new_slot);
      poVar4 = std::operator<<(poVar4,".");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
      poVar4 = ::operator<<(poVar4,new_part);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      Am_Error();
    }
    if (prev_part.data != (Am_Object_Data *)0x0) {
      Remove_Slot(this,key);
    }
    Am_Wrapper::Note_Reference(&prev_owner->super_Am_Wrapper);
    (prev_owner->owner_slot).super_Am_Value.value = (anon_union_8_8_ea4c8939_for_value)this->data;
    (prev_owner->part_slot).context = this->data;
    prev_owner->next_part = this->data->first_part;
    this->data->first_part = prev_owner;
    (prev_owner->part_slot).key = key;
    old_cc = (Am_Constraint_Context *)&prev_owner->part_slot;
    DynArray::Add(&this->data->data,(char *)&old_cc);
    Am_Demon_Queue::Prevent_Invoke(&this->data->demon_queue);
    local_80 = Am_Object_Advanced::Swap_Context(Am_Empty_Constraint_Context);
    if (((this->data->demons_active & 0x8000) != 0) &&
       (this->data->demon_set->add_part_demon != (Am_Part_Demon *)0x0)) {
      pAVar1 = this->data->demon_set->add_part_demon;
      Am_Object(&local_88,this);
      Am_Object(&local_90,&Am_No_Object);
      Am_Object(&local_98,new_part);
      (*pAVar1)(in_stack_fffffffffffffe78,in_stack_fffffffffffffe80,in_stack_fffffffffffffe88);
      ~Am_Object(&local_98);
      ~Am_Object(&local_90);
      ~Am_Object(&local_88);
    }
    if (((prev_owner->demons_active & 0x8000) != 0) &&
       (prev_owner->demon_set->change_owner_demon != (Am_Part_Demon *)0x0)) {
      pAVar1 = prev_owner->demon_set->change_owner_demon;
      Am_Object(&local_a0,new_part);
      Am_Object(&local_a8,(Am_Object_Data *)new_slot);
      Am_Object((Am_Object *)&oldval.value,this);
      (*pAVar1)(in_stack_fffffffffffffe78,in_stack_fffffffffffffe80,in_stack_fffffffffffffe88);
      ~Am_Object((Am_Object *)&oldval.value);
      ~Am_Object(&local_a8);
      ~Am_Object(&local_a0);
    }
    Am_Object_Advanced::Swap_Context(local_80);
    Am_Demon_Queue::Release_Invoke(&this->data->demon_queue);
    if (new_slot != (Am_Slot_Data *)0x0) {
      Am_Wrapper::Note_Reference((Am_Wrapper *)new_slot);
    }
    Am_Wrapper::Note_Reference(&this->data->super_Am_Wrapper);
    Am_Value::Am_Value((Am_Value *)&newval.value,(Am_Wrapper *)new_slot);
    Am_Value::Am_Value((Am_Value *)local_d0,&this->data->super_Am_Wrapper);
    pAVar2 = &prev_owner->owner_slot;
    Am_Slot::Am_Slot(&local_d8,&prev_owner->part_slot);
    am_CList::Change(&pAVar2->dependencies,&local_d8,(Am_Constraint *)0x0,(Am_Value *)&newval.value,
                     (Am_Value *)local_d0);
    pAVar5 = operator_cast_to_Am_Wrapper_(&Am_No_Object);
    Am_Value::operator=((Am_Value *)&newval.value,pAVar5);
    pAVar5 = operator_cast_to_Am_Wrapper_(new_part);
    Am_Value::operator=((Am_Value *)local_d0,pAVar5);
    this_00 = &(prev_owner->part_slot).dependencies;
    Am_Slot::Am_Slot(&local_e0,&prev_owner->part_slot);
    am_CList::Change(this_00,&local_e0,(Am_Constraint *)0x0,(Am_Value *)&newval.value,
                     (Am_Value *)local_d0);
    bVar3 = Valid(&local_40);
    if (bVar3) {
      Destroy(&local_40);
    }
    Am_Value::~Am_Value((Am_Value *)local_d0);
    Am_Value::~Am_Value((Am_Value *)&newval.value);
  }
LAB_0025d43b:
  ~Am_Object(&local_40);
  return this_local;
}

Assistant:

Am_Object &
Am_Object::Add_Part(Am_Slot_Key key, Am_Object new_part,
                    Am_Slot_Flags set_flags)
{
  if (!data)
    slot_error("Add_Part called on a (0L) object", key);
  Am_Slot_Data *slot = data->find_slot(key);
  Am_Object prev_part;
  if (slot && slot->type != Am_MISSING_SLOT) {
    if ((slot->flags & BIT_IS_PART)) {
      if (!(set_flags & Am_OK_IF_THERE)) {
        slot_error("Add_Part called on part slot which is already there.  "
                   "Use Set_Part instead",
                   slot);
        return Am_No_Object;
      }
      prev_part = Get_Object(key); //not very efficient, but safer
    } else {
      if (!(set_flags & Am_OK_IF_THERE)) {
        slot->context->Note_Reference();
        Am_Object obj = Am_Object(slot->context);
        std::cerr << "** Add_Part can only be called with slots that are not "
                     "already in the object.  But Object "
                  << obj << " already has slot ";
        Am_Print_Key(std::cerr, slot->key);
        std::cerr << ".\n";
        Am_Error(obj, slot->key);
        return Am_No_Object;
      }
    }
  }
  if (new_part.Valid()) {
    Am_Object_Data *added_part = new_part.data;
    Am_Object_Data *prev_owner =
        (Am_Object_Data *)added_part->owner_slot.value.wrapper_value;
    if (prev_owner) {
      std::cerr << "** Attempted to add object, " << new_part << ", to object, "
                << *this << ", when it already has owner, " << prev_owner << "."
                << std::endl;
      Am_ERROR(new_part);
    }
    if (slot)
      Remove_Slot(key); //if old slot exists, remove it

    added_part->Note_Reference();
    added_part->owner_slot.value.wrapper_value = data;
    added_part->part_slot.context = data;
    added_part->next_part = data->first_part;
    data->first_part = added_part;
    added_part->part_slot.key = key;
    Am_Slot_Data *new_slot = &(added_part->part_slot);
    data->data.Add((char *)&new_slot);
    data->demon_queue.Prevent_Invoke();
    Am_PUSH_EMPTY_CC() if ((data->demons_active & DEMONS_ACTIVE) &&
                           data->demon_set->add_part_demon)
        data->demon_set->add_part_demon(*this, Am_No_Object, new_part);
    if ((added_part->demons_active & DEMONS_ACTIVE) &&
        added_part->demon_set->change_owner_demon)
      added_part->demon_set->change_owner_demon(new_part, Am_Object(prev_owner),
                                                *this);
    Am_POP_EMPTY_CC() data->demon_queue.Release_Invoke();
    if (prev_owner)
      prev_owner->Note_Reference();
    data->Note_Reference();
    Am_Value oldval(prev_owner), newval(data);
    added_part->owner_slot.dependencies.Change(&added_part->part_slot, nullptr,
                                               oldval, newval);
    oldval = Am_No_Object;
    newval = new_part;
    added_part->part_slot.dependencies.Change(&added_part->part_slot, nullptr,
                                              oldval, newval);
    if (prev_part.Valid())
      prev_part.Destroy();
  }
  return *this;
}